

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O1

void ebur128_check_true_peak(ebur128_state *st,size_t frames)

{
  double *pdVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ebur128_state_internal *peVar5;
  interpolator *piVar6;
  float **ppfVar7;
  float *pfVar8;
  interp_filter *piVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  float *pfVar13;
  uint uVar14;
  size_t sVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  float *pfVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  float fVar23;
  double dVar24;
  float *local_70;
  
  peVar5 = st->d;
  piVar6 = peVar5->interp;
  uVar2 = piVar6->factor;
  uVar11 = (ulong)uVar2;
  if (frames != 0) {
    uVar3 = piVar6->channels;
    uVar12 = (ulong)uVar3;
    uVar4 = piVar6->delay;
    pfVar19 = peVar5->resampler_buffer_input;
    local_70 = peVar5->resampler_buffer_output;
    sVar15 = 0;
    do {
      if (uVar12 != 0) {
        ppfVar7 = piVar6->z;
        uVar14 = piVar6->zi;
        uVar21 = 0;
        do {
          pfVar8 = ppfVar7[uVar21];
          pfVar8[uVar14] = *pfVar19;
          if (uVar11 != 0) {
            pfVar13 = local_70 + uVar21;
            piVar9 = piVar6->filter;
            uVar18 = 0;
            do {
              if ((ulong)piVar9[uVar18].count == 0) {
                fVar23 = 0.0;
              }
              else {
                dVar24 = 0.0;
                uVar20 = 0;
                do {
                  iVar22 = uVar14 - piVar9[uVar18].index[uVar20];
                  if (iVar22 < 0) {
                    iVar22 = iVar22 + piVar6->delay;
                  }
                  dVar24 = dVar24 + (double)pfVar8[iVar22] * piVar9[uVar18].coeff[uVar20];
                  uVar20 = uVar20 + 1;
                } while (piVar9[uVar18].count != uVar20);
                fVar23 = (float)dVar24;
              }
              *pfVar13 = fVar23;
              pfVar13 = pfVar13 + uVar12;
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar11);
          }
          pfVar19 = pfVar19 + 1;
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar12);
      }
      uVar14 = piVar6->zi + 1;
      if (uVar14 == uVar4) {
        uVar14 = 0;
      }
      local_70 = local_70 + uVar3 * uVar2;
      piVar6->zi = uVar14;
      sVar15 = sVar15 + 1;
    } while (sVar15 != frames);
  }
  if (uVar11 * frames != 0) {
    uVar12 = (ulong)st->channels;
    lVar16 = 0;
    lVar17 = 0;
    do {
      if (uVar12 != 0) {
        pdVar10 = st->d->prev_true_peak;
        pfVar19 = st->d->resampler_buffer_output;
        uVar21 = 0;
        do {
          fVar23 = *(float *)((long)pfVar19 + uVar21 * 4 + lVar16);
          dVar24 = (double)fVar23;
          if (fVar23 <= 0.0) {
            dVar24 = -dVar24;
          }
          pdVar1 = pdVar10 + uVar21;
          if (*pdVar1 <= dVar24 && dVar24 != *pdVar1) {
            pdVar10[uVar21] = dVar24;
          }
          uVar21 = uVar21 + 1;
        } while (uVar12 != uVar21);
      }
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + uVar12 * 4;
    } while (lVar17 != uVar11 * frames);
  }
  return;
}

Assistant:

static void ebur128_check_true_peak(ebur128_state* st, size_t frames) {
  size_t c, i, frames_out;

  frames_out =
      interp_process(st->d->interp, frames, st->d->resampler_buffer_input,
                     st->d->resampler_buffer_output);

  for (i = 0; i < frames_out; ++i) {
    for (c = 0; c < st->channels; ++c) {
      double val =
          (double) st->d->resampler_buffer_output[i * st->channels + c];

      if (EBUR128_MAX(val, -val) > st->d->prev_true_peak[c]) {
        st->d->prev_true_peak[c] = EBUR128_MAX(val, -val);
      }
    }
  }
}